

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

int If_DsdManCheckInv_rec(If_DsdMan_t *p,int iLit)

{
  int iVar1;
  If_DsdObj_t *pObj;
  uint i;
  
  do {
    iVar1 = Abc_Lit2Var(iLit);
    pObj = (If_DsdObj_t *)Vec_PtrEntry(&p->vObjs,iVar1);
    switch(*(uint *)&pObj->field_0x4 & 7) {
    case 2:
      return 1;
    case 3:
    case 6:
      return 0;
    case 4:
      i = 0;
      while( true ) {
        if (*(uint *)&pObj->field_0x4 >> 0x1b <= i) {
          return 0;
        }
        iVar1 = If_DsdObjFaninLit(pObj,i);
        if (iVar1 == 0) break;
        iVar1 = If_DsdManCheckInv_rec(p,iVar1);
        i = i + 1;
        if (iVar1 != 0) {
          return 1;
        }
      }
      return 0;
    case 5:
      iVar1 = If_DsdManCheckInv_rec(p,*(int *)&pObj[1].field_0x4);
      if (iVar1 == 0) {
        return 0;
      }
      iLit = pObj[2].Id;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                    ,0x5b7,"int If_DsdManCheckInv_rec(If_DsdMan_t *, int)");
    }
  } while( true );
}

Assistant:

int If_DsdManCheckInv_rec( If_DsdMan_t * p, int iLit )
{
    If_DsdObj_t * pObj;
    int i, iFanin;
    pObj = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(iLit) );
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
        return 1;
    if ( If_DsdObjType(pObj) == IF_DSD_AND || If_DsdObjType(pObj) == IF_DSD_PRIME )
        return 0;
    if ( If_DsdObjType(pObj) == IF_DSD_XOR )
    {
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
            if ( If_DsdManCheckInv_rec(p, iFanin) )
                return 1;
        return 0;
    }
    if ( If_DsdObjType(pObj) == IF_DSD_MUX )
        return If_DsdManCheckInv_rec(p, pObj->pFans[1]) && If_DsdManCheckInv_rec(p, pObj->pFans[2]);
    assert( 0 );
    return 0;
}